

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

__pid_t __thiscall Process::wait(Process *this,void *__stat_loc)

{
  code *pcVar1;
  int *piVar2;
  int iVar3;
  __pid_t _Var4;
  undefined8 uVar5;
  long lVar6;
  int status_1;
  siginfo_t sigInfo;
  int local_b4;
  siginfo_t local_b0;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&ProcessFramework::mutex);
  if (iVar3 != 0) {
    iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                          ,0x4ee,"pthread_mutex_lock(&ProcessFramework::mutex) == 0");
    if (iVar3 != 0) goto LAB_00104dbd;
  }
  if (ProcessFramework::signaled == -1) {
    ProcessFramework::signaled = 0;
    iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&ProcessFramework::mutex);
    if (iVar3 == 0) {
LAB_00104cd3:
      lVar6 = 0;
      goto LAB_00104da8;
    }
    uVar5 = 0x507;
  }
  else if (ProcessFramework::signaled == 0) {
    if (__stat_loc == (void *)0x0) {
      ProcessFramework::waitState = 1;
      do {
        iVar3 = pthread_cond_wait((pthread_cond_t *)&ProcessFramework::condition,
                                  (pthread_mutex_t *)&ProcessFramework::mutex);
        if (iVar3 != 0) {
          iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                                ,0x4f7,
                                "pthread_cond_wait(&ProcessFramework::condition, &ProcessFramework::mutex) == 0"
                               );
          if (iVar3 != 0) goto LAB_00104dbd;
        }
      } while (ProcessFramework::signaled == 0);
      if (-1 < ProcessFramework::signaled) {
        iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                              ,0x4fa,"ProcessFramework::signaled < 0");
        if (iVar3 != 0) goto LAB_00104dbd;
      }
      lVar6 = 0;
      ProcessFramework::signaled = 0;
      ProcessFramework::waitState = 0;
      iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&ProcessFramework::mutex);
      if (iVar3 == 0) goto LAB_00104da8;
      uVar5 = 0x4fd;
    }
    else {
      ProcessFramework::waitState = 2;
      iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&ProcessFramework::mutex);
      if (iVar3 != 0) {
        iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                              ,0x514,"pthread_mutex_unlock(&ProcessFramework::mutex) == 0");
        if (iVar3 != 0) goto LAB_00104dbd;
      }
      lVar6 = 0;
      iVar3 = waitid(P_ALL,0,&local_b0,0x1000004);
      if (iVar3 == -1) goto LAB_00104da8;
      if (0 < (long)__stat_loc) {
        piVar2 = &this->fdStdOutRead;
        do {
          lVar6 = *(long *)this;
          if (local_b0._sifields._pad[0] == *(int *)(lVar6 + 0xc)) goto LAB_00104da8;
          this = (Process *)&this->fdStdInWrite;
        } while (this < piVar2 + (long)__stat_loc * 2);
      }
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)&ProcessFramework::mutex);
      if (iVar3 != 0) {
        iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                              ,0x51d,"pthread_mutex_lock(&ProcessFramework::mutex) == 0");
        if (iVar3 != 0) goto LAB_00104dbd;
      }
      if (local_b0._sifields._pad[0] == ProcessFramework::signaled) {
        _Var4 = waitpid(local_b0._sifields._kill.si_pid,&local_b4,0);
        if (_Var4 == ProcessFramework::signaled) {
          ProcessFramework::signaled = 0;
        }
      }
      ProcessFramework::waitState = 0;
      iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&ProcessFramework::mutex);
      if (iVar3 == 0) goto LAB_00104cd3;
      uVar5 = 0x526;
    }
  }
  else {
    _Var4 = waitpid(ProcessFramework::signaled,&local_b0.si_signo,0);
    if (_Var4 == ProcessFramework::signaled) {
      ProcessFramework::signaled = 0;
    }
    ProcessFramework::waitState = 0;
    iVar3 = pthread_mutex_unlock((pthread_mutex_t *)&ProcessFramework::mutex);
    if (iVar3 == 0) goto LAB_00104cd3;
    uVar5 = 0x511;
  }
  lVar6 = 0;
  iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                        ,uVar5,"pthread_mutex_unlock(&ProcessFramework::mutex) == 0");
  if (iVar3 != 0) {
LAB_00104dbd:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
LAB_00104da8:
  return (__pid_t)lVar6;
}

Assistant:

Process* Process::wait(Process** processes, usize count)
{
#ifdef _WIN32
  EnterCriticalSection(&ProcessFramework::criticalSection);
  if(ProcessFramework::hInterruptEvent == INVALID_HANDLE_VALUE)
    ProcessFramework::hInterruptEvent = CreateEvent(NULL, FALSE, FALSE, NULL);
  LeaveCriticalSection(&ProcessFramework::criticalSection);
  HANDLE handles[MAXIMUM_WAIT_OBJECTS];
  Process* processMap[MAXIMUM_WAIT_OBJECTS];
  Process** p = processMap;
  handles[0] = ProcessFramework::hInterruptEvent;
  Process** pend = processes + count;
  HANDLE* hend = handles + MAXIMUM_WAIT_OBJECTS;
  HANDLE* h = handles + 1;
  for(; processes < pend; ++processes)
  {
    Process* process = *processes;
    if(process->hProcess == INVALID_HANDLE_VALUE)
      continue;
    *(h++) = process->hProcess;
    *(p++) = process;
    if(h >= hend)
      break;
  }
  DWORD dw = WaitForMultipleObjects((DWORD)(h - handles), handles, FALSE, INFINITE);
  ssize pIndex;
  if(dw <= WAIT_OBJECT_0 || (pIndex = dw - (WAIT_OBJECT_0 + 1)) >= p - processMap)
    return 0;
  return processMap[pIndex];
#else
  VERIFY(pthread_mutex_lock(&ProcessFramework::mutex) == 0);
  switch(ProcessFramework::signaled)
  {
  case 0:
    if(count == 0)
    {
      ProcessFramework::waitState = 1;
      for(;;)
      {
        VERIFY(pthread_cond_wait(&ProcessFramework::condition, &ProcessFramework::mutex) == 0);
        if(ProcessFramework::signaled)
        {
          ASSERT(ProcessFramework::signaled < 0);
          ProcessFramework::signaled = 0;
          ProcessFramework::waitState = 0;
          VERIFY(pthread_mutex_unlock(&ProcessFramework::mutex) == 0);
          return 0;
        }
      }
    }
    else
      ProcessFramework::waitState = 2;
    break;
  case -1:
    ProcessFramework::signaled = 0;
    VERIFY(pthread_mutex_unlock(&ProcessFramework::mutex) == 0);
    return 0;
  default:
    {
      int status;
      pid_t pid = waitpid(ProcessFramework::signaled, &status, 0);
      if(pid == ProcessFramework::signaled)
        ProcessFramework::signaled = 0;
      ProcessFramework::waitState = 0;
    }
    VERIFY(pthread_mutex_unlock(&ProcessFramework::mutex) == 0);
    return 0;
  }
  VERIFY(pthread_mutex_unlock(&ProcessFramework::mutex) == 0);
  siginfo_t sigInfo;
  pid_t ret = waitid(P_ALL, 0, &sigInfo, WEXITED | WNOWAIT);
  if(ret != -1)
  {
    pid_t pid = sigInfo.si_pid;
    for(Process** end = processes + count; processes < end; ++processes)
      if(pid == (pid_t)(*processes)->pid)
        return *processes;
    VERIFY(pthread_mutex_lock(&ProcessFramework::mutex) == 0);
    if(pid == ProcessFramework::signaled)
    {
        int status;
        pid_t pid = waitpid(ProcessFramework::signaled, &status, 0);
        if(pid == ProcessFramework::signaled)
          ProcessFramework::signaled = 0;
    }
    ProcessFramework::waitState = 0;
    VERIFY(pthread_mutex_unlock(&ProcessFramework::mutex) == 0);
  }
  return 0;
#endif
}